

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_sampler.cc
# Opt level: O1

void __thiscall quic::BandwidthSampler::EnableOverestimateAvoidance(BandwidthSampler *this)

{
  if (this->overestimate_avoidance_ == false) {
    this->overestimate_avoidance_ = true;
    (this->max_ack_height_tracker_).ack_aggregation_bandwidth_threshold_ = 2.0;
  }
  return;
}

Assistant:

void BandwidthSampler::EnableOverestimateAvoidance() {
  if (overestimate_avoidance_) {
    return;
  }

  overestimate_avoidance_ = true;
  // TODO(wub): Change the default value of
  // --quic_ack_aggregation_bandwidth_threshold to 2.0.
  max_ack_height_tracker_.SetAckAggregationBandwidthThreshold(2.0);
}